

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratiotest.cpp
# Opt level: O2

double step(double x,double p,double l,double u,double t)

{
  double dVar1;
  
  if ((l == -INFINITY) || (-t <= p)) {
    dVar1 = INFINITY;
    if ((u != INFINITY) && (t < p)) {
      dVar1 = (u - x) / p;
    }
  }
  else {
    dVar1 = (l - x) / p;
  }
  return dVar1;
}

Assistant:

static double step(double x, double p, double l, double u, double t) {
  if (p < -t && l > -std::numeric_limits<double>::infinity()) {
    return (l - x) / p;
  } else if (p > t && u < std::numeric_limits<double>::infinity()) {
    return (u - x) / p;
  } else {
    return std::numeric_limits<double>::infinity();
  }
}